

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O0

void __thiscall
zstr::detail::z_stream_wrapper::z_stream_wrapper
          (z_stream_wrapper *this,bool _is_input,int _level,int _window_bits)

{
  int iVar1;
  undefined8 uVar2;
  int in_ECX;
  undefined4 in_EDX;
  undefined1 in_SIL;
  undefined8 *in_RDI;
  int ret;
  int local_3c;
  int local_34;
  int in_stack_ffffffffffffffe4;
  undefined3 in_stack_fffffffffffffff4;
  uint uVar3;
  
  uVar3 = CONCAT13(in_SIL,in_stack_fffffffffffffff4) & 0x1ffffff;
  *(char *)(in_RDI + 0xe) = (char)(uVar3 >> 0x18);
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  if ((*(byte *)(in_RDI + 0xe) & 1) == 0) {
    local_3c = in_ECX;
    if (in_ECX == 0) {
      local_3c = 0x1f;
    }
    iVar1 = deflateInit2_(in_RDI,in_EDX,8,local_3c,8,0,"1.2.11",0x70);
  }
  else {
    *(undefined4 *)(in_RDI + 1) = 0;
    *in_RDI = 0;
    local_34 = in_ECX;
    if (in_ECX == 0) {
      local_34 = 0x2f;
    }
    iVar1 = inflateInit2_(in_RDI,local_34,"1.2.11",0x70);
  }
  if (iVar1 == 0) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x20);
  Exception::Exception
            ((Exception *)CONCAT44(uVar3,in_EDX),(z_stream *)CONCAT44(in_ECX,iVar1),
             in_stack_ffffffffffffffe4);
  __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

z_stream_wrapper(bool _is_input, int _level, int _window_bits)
      : is_input(_is_input) {
    this->zalloc = nullptr;  // Z_NULL
    this->zfree = nullptr;   // Z_NULL
    this->opaque = nullptr;  // Z_NULL
    int ret;
    if (is_input) {
      this->avail_in = 0;
      this->next_in = nullptr;  // Z_NULL
      ret = inflateInit2(this, _window_bits ? _window_bits : 15 + 32);
    } else {
      ret = deflateInit2(this, _level, Z_DEFLATED,
                         _window_bits ? _window_bits : 15 + 16, 8,
                         Z_DEFAULT_STRATEGY);
    }
    if (ret != Z_OK) throw Exception(this, ret);
  }